

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

int lest::select(int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
                timeval *__timeout)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  bool bVar3;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  int iVar4;
  uint uVar5;
  undefined4 in_register_0000003c;
  string *psVar7;
  text *name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  fd_set *local_110;
  text local_108;
  text local_e8;
  text local_c8;
  text local_a8;
  text local_88;
  text local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  string *psVar6;
  
  psVar7 = (string *)CONCAT44(in_register_0000003c,__nfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__readfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    name = &local_68;
    std::__cxx11::string::string((string *)name,psVar7);
    bVar2 = hidden(name);
    uVar5 = (uint)CONCAT71(extraout_var,bVar2);
LAB_0010b8a0:
    uVar5 = uVar5 ^ 1;
    std::__cxx11::string::~string((string *)name);
  }
  else {
    bVar2 = false;
    psVar6 = psVar7;
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __readfds->fds_bits[1];
    local_110 = __readfds;
    do {
      do {
        __lhs = pbVar1 + -1;
        if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_110->fds_bits[0]) {
          if (bVar2) {
            name = &local_c8;
            std::__cxx11::string::string((string *)name,psVar7);
            bVar2 = hidden(name);
            uVar5 = (uint)CONCAT71(extraout_var_00,bVar2);
            goto LAB_0010b8a0;
          }
          goto LAB_0010b8d0;
        }
        bVar2 = std::operator==(__lhs,"@");
        psVar6 = (string *)CONCAT71((int7)((ulong)psVar6 >> 8),1);
        iVar4 = (int)psVar6;
        if (bVar2) {
          return iVar4;
        }
        bVar2 = std::operator==(__lhs,"*");
        if (bVar2) {
          return iVar4;
        }
        std::__cxx11::string::string((string *)&local_88,(string *)__lhs);
        std::__cxx11::string::string((string *)&local_a8,psVar7);
        bVar2 = search(&local_88,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_88);
        if (bVar2) {
          return iVar4;
        }
        bVar2 = *(__lhs->_M_dataplus)._M_p == '!';
        pbVar1 = __lhs;
      } while (!bVar2);
      std::__cxx11::string::substr((ulong)&local_130,(ulong)__lhs);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      if (local_130 == &local_120) {
        local_108.field_2._8_8_ = local_120._8_8_;
      }
      else {
        local_108._M_dataplus._M_p = (pointer)local_130;
      }
      local_108.field_2._M_allocated_capacity._1_7_ = local_120._M_allocated_capacity._1_7_;
      local_108.field_2._M_local_buf[0] = local_120._M_local_buf[0];
      local_108._M_string_length = local_128;
      local_128 = 0;
      local_120._M_local_buf[0] = '\0';
      local_130 = &local_120;
      std::__cxx11::string::string((string *)&local_e8,psVar7);
      bVar3 = search(&local_108,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_130);
    } while (!bVar3);
LAB_0010b8d0:
    uVar5 = 0;
  }
  return uVar5;
}

Assistant:

inline bool select( text name, texts include )
{
    if ( none( include ) )
    {
        return ! hidden( name );
    }

    bool any = false;
    for ( texts::reverse_iterator pos = include.rbegin(); pos != include.rend(); ++pos )
    {
        text & part = *pos;

        if ( part == "@" || part == "*" )
            return true;

        if ( search( part, name ) )
            return true;

        if ( '!' == part[0] )
        {
            any = true;
            if ( search( part.substr(1), name ) )
                return false;
        }
        else
        {
            any = false;
        }
    }
    return any && ! hidden( name );
}